

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O0

void __thiscall
adios2::core::Stream::Stream
          (Stream *this,string *name,Mode mode,string *configFile,string *ioInConfigFile,
          string *hostLanguage)

{
  string *in_RCX;
  string *in_R8;
  string *in_R9;
  string local_a8 [32];
  string local_88 [32];
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  Comm *in_stack_ffffffffffffffa8;
  Mode in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  Stream *in_stack_ffffffffffffffc0;
  string *hostLanguage_00;
  
  hostLanguage_00 = in_R9;
  helper::CommDummy();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,in_RCX);
  std::__cxx11::string::string(local_88,in_R8);
  std::__cxx11::string::string(local_a8,(string *)in_R9);
  Stream(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
         in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
         hostLanguage_00);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  helper::Comm::~Comm((Comm *)0x901c60);
  return;
}

Assistant:

Stream::Stream(const std::string &name, const Mode mode, const std::string configFile,
               const std::string ioInConfigFile, const std::string hostLanguage)
: Stream(name, mode, helper::CommDummy(), configFile, ioInConfigFile, hostLanguage)
{
}